

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

Vec_Ptr_t * Nwk_ManDfs(Nwk_Man_t *pNtk)

{
  uint uVar1;
  Nwk_Obj_t *pObj;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar4->pArray[lVar6];
      if (pObj != (Nwk_Obj_t *)0x0) {
        uVar2 = *(uint *)&pObj->field_0x20 & 7;
        if (uVar2 == 2) {
          Nwk_ManDfs_rec(pObj,vNodes);
        }
        else if (uVar2 == 1) {
          pObj->TravId = pObj->pMan->nTravIds;
          uVar2 = vNodes->nSize;
          uVar1 = vNodes->nCap;
          if (uVar2 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
              }
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar1 * 2;
              if (iVar5 <= (int)uVar1) goto LAB_008dc8f5;
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
              }
            }
            vNodes->pArray = ppvVar3;
            vNodes->nCap = iVar5;
          }
LAB_008dc8f5:
          vNodes->nSize = uVar2 + 1;
          vNodes->pArray[(int)uVar2] = pObj;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar6 < pVVar4->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfs( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            Nwk_ObjSetTravIdCurrent( pObj );
            Vec_PtrPush( vNodes, pObj );
        }
        else if ( Nwk_ObjIsCo(pObj) )
            Nwk_ManDfs_rec( pObj, vNodes );
    }
    return vNodes;
}